

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcp.cc
# Opt level: O1

void __thiscall XcpOptions::Init(XcpOptions *this,int argc,char **argv)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  string *psVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  allocator local_a1;
  ulong local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  common::Options::Init(&this->super_Options,argc,argv);
  uVar2 = (this->super_Options).opt_cur;
  uVar3 = (ulong)uVar2;
  iVar4 = uVar2 + 2;
  if (argc < (int)(uVar2 + 2)) {
    iVar4 = argc;
  }
  if ((int)uVar2 < iVar4) {
    local_78 = (string *)&this->local_path;
    local_80 = (string *)&this->remote_path;
    local_a0 = uVar3;
    do {
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_50,argv[(int)uVar3],&local_a1);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,":","");
      xlib::Split(&local_50,&local_70,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      psVar5 = local_78;
      if ((long)local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x40) {
        if ((int)local_a0 == (this->super_Options).opt_cur) {
          this->remote_to_local = true;
        }
        else {
          this->local_to_remote = true;
        }
        common::Options::ParseHosts
                  (&this->super_Options,
                   local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        psVar5 = local_80;
      }
      std::__cxx11::string::_M_assign(psVar5);
      piVar1 = &(this->super_Options).opt_cur;
      *piVar1 = *piVar1 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      uVar2 = (this->super_Options).opt_cur;
      uVar3 = (ulong)uVar2;
    } while ((int)uVar2 < iVar4);
  }
  return;
}

Assistant:

void Init(int argc, char **argv) {
        common::Options::Init(argc, argv);
        int pre = opt_cur;
        while ( opt_cur < argc && (pre + 2)>opt_cur ) {
            std::vector<std::string> vec;
            xlib::Split(argv[opt_cur], ":", &vec);
            if (vec.size() == 2) {
                (pre == opt_cur) ? remote_to_local = true : local_to_remote = true;
                common::Options::ParseHosts(vec[0]);
                remote_path = vec[1];
            } else {
                local_path = vec[0];
            }
            opt_cur++;
        }
    }